

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void __thiscall
rr::SingleSampleLineRasterizer::rasterize
          (SingleSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  deInt64 dVar4;
  int *piVar5;
  deUint64 dVar6;
  float fVar7;
  float fVar8;
  int local_298;
  int local_280;
  int local_27c;
  deInt32 local_274;
  Vector<float,_4> local_268;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  Vector<float,_4> local_238;
  undefined1 local_228 [8];
  Vec4 ooSum;
  Vec4 b1;
  Vec4 b0;
  FragmentPacket *packet;
  float zb;
  float za;
  undefined8 local_1e0;
  IVec2 fragmentPos;
  int replicationId;
  int rowFragEnd;
  int rowFragBegin;
  int fragmentLocation;
  undefined1 local_1c0 [8];
  Vector<float,_2> local_1b8;
  tcu local_1b0 [16];
  undefined1 local_1a0 [28];
  undefined1 local_184 [12];
  undefined1 local_178 [4];
  float t;
  Vector<long,_2> pr;
  Vector<long,_2> local_158;
  undefined1 local_148 [8];
  Vector<long,_2> diamondPosition;
  undefined1 local_130 [4];
  int packetNdx;
  SubpixelLineSegment line;
  Vec2 local_100;
  Vector<long,_2> local_f8;
  undefined1 local_e8 [8];
  Vector<long,_2> pb;
  Vec2 local_c8;
  Vector<long,_2> local_c0;
  undefined1 local_b0 [8];
  Vector<long,_2> pa;
  Vector<long,_2> local_90;
  undefined1 local_80 [8];
  Vector<long,_2> widthOffset;
  int maxViewportLimit;
  int minViewportLimit;
  IVec2 minorDirection;
  Vector<float,_4> local_50;
  byte local_3d;
  deInt32 local_3c;
  bool isXMajor;
  undefined8 uStack_38;
  deInt32 lineWidth;
  deInt64 halfPixel;
  int *numPacketsRasterized_local;
  float *pfStack_20;
  int maxFragmentPackets_local;
  float *depthValues_local;
  FragmentPacket *fragmentPackets_local;
  SingleSampleLineRasterizer *this_local;
  
  uStack_38 = 0x80;
  halfPixel = (deInt64)numPacketsRasterized;
  numPacketsRasterized_local._4_4_ = maxFragmentPackets;
  pfStack_20 = depthValues;
  depthValues_local = (float *)fragmentPackets;
  fragmentPackets_local = (FragmentPacket *)this;
  if (this->m_lineWidth <= 1.0) {
    local_274 = 1;
  }
  else {
    local_274 = deFloorFloatToInt32(this->m_lineWidth + 0.5);
  }
  local_3c = local_274;
  tcu::operator-((tcu *)&local_50,&this->m_v1,&this->m_v0);
  pfVar3 = tcu::Vector<float,_4>::x(&local_50);
  fVar7 = de::abs<float>(*pfVar3);
  tcu::operator-((tcu *)&minorDirection,&this->m_v1,&this->m_v0);
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&minorDirection);
  fVar8 = de::abs<float>(*pfVar3);
  local_3d = fVar8 <= fVar7;
  if ((bool)local_3d) {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&maxViewportLimit,0,1);
  }
  else {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&maxViewportLimit,1,0);
  }
  if ((local_3d & 1) == 0) {
    local_27c = tcu::Vector<int,_4>::x(&this->m_viewport);
  }
  else {
    local_27c = tcu::Vector<int,_4>::y(&this->m_viewport);
  }
  widthOffset.m_data[1]._4_4_ = local_27c;
  if ((local_3d & 1) == 0) {
    local_280 = tcu::Vector<int,_4>::x(&this->m_viewport);
    iVar2 = tcu::Vector<int,_4>::z(&this->m_viewport);
    local_280 = local_280 + iVar2;
  }
  else {
    local_280 = tcu::Vector<int,_4>::y(&this->m_viewport);
    iVar2 = tcu::Vector<int,_4>::w(&this->m_viewport);
    local_280 = local_280 + iVar2;
  }
  widthOffset.m_data[1]._0_4_ = local_280;
  tcu::Vector<int,_2>::cast<long>((Vector<int,_2> *)(pa.m_data + 1));
  tcu::operator-((tcu *)&local_90,(Vector<long,_2> *)(pa.m_data + 1));
  dVar4 = toSubpixelCoord(local_3c + -1);
  tcu::operator*((tcu *)local_80,&local_90,dVar4 / 2);
  join_0x00000010_0x00000000_ = tcu::Vector<float,_4>::xy(&this->m_v0);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_c8);
  LineRasterUtil::toSubpixelVector((LineRasterUtil *)&local_c0,&local_c8);
  tcu::operator+((tcu *)local_b0,&local_c0,(Vector<long,_2> *)local_80);
  join_0x00000010_0x00000000_ = tcu::Vector<float,_4>::xy(&this->m_v1);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_100);
  LineRasterUtil::toSubpixelVector((LineRasterUtil *)&local_f8,&local_100);
  tcu::operator+((tcu *)local_e8,&local_f8,(Vector<long,_2> *)local_80);
  LineRasterUtil::SubpixelLineSegment::SubpixelLineSegment
            ((SubpixelLineSegment *)local_130,(Vector<long,_2> *)local_b0,
             (Vector<long,_2> *)local_e8);
  diamondPosition.m_data[1]._4_4_ = 0;
  do {
    piVar5 = tcu::Vector<int,_2>::y(&this->m_curPos);
    iVar2 = *piVar5;
    piVar5 = tcu::Vector<int,_2>::y(&this->m_bboxMax);
    if (*piVar5 < iVar2 || numPacketsRasterized_local._4_4_ <= diamondPosition.m_data[1]._4_4_) {
      *(int *)halfPixel = diamondPosition.m_data[1]._4_4_;
      return;
    }
    LineRasterUtil::toSubpixelVector((LineRasterUtil *)&local_158,&this->m_curPos);
    tcu::Vector<long,_2>::Vector((Vector<long,_2> *)(pr.m_data + 1),0x80,0x80);
    tcu::operator+((tcu *)local_148,&local_158,(Vector<long,_2> *)(pr.m_data + 1));
    bVar1 = LineRasterUtil::doesLineSegmentExitDiamond
                      ((SubpixelLineSegment *)local_130,(Vector<long,_2> *)local_148);
    if (bVar1) {
      tcu::Vector<long,_2>::Vector((Vector<long,_2> *)local_178,(Vector<long,_2> *)local_148);
      tcu::operator-((tcu *)(local_1a0 + 8),(Vector<long,_2> *)local_178,(Vector<long,_2> *)local_b0
                    );
      tcu::Vector<long,_2>::asFloat((Vector<long,_2> *)local_184);
      tcu::operator-(local_1b0,(Vector<long,_2> *)local_e8,(Vector<long,_2> *)local_b0);
      tcu::Vector<long,_2>::asFloat((Vector<long,_2> *)local_1a0);
      fVar7 = tcu::dot<float,2>((Vector<float,_2> *)local_184,(Vector<float,_2> *)local_1a0);
      tcu::Vector<long,_2>::asFloat((Vector<long,_2> *)local_1c0);
      tcu::Vector<long,_2>::asFloat((Vector<long,_2> *)&rowFragBegin);
      tcu::operator-((tcu *)&local_1b8,(Vector<float,_2> *)local_1c0,
                     (Vector<float,_2> *)&rowFragBegin);
      local_184._8_4_ = tcu::lengthSquared<float,2>(&local_1b8);
      local_184._8_4_ = fVar7 / (float)local_184._8_4_;
      if ((local_3d & 1) == 0) {
        piVar5 = tcu::Vector<int,_2>::x(&this->m_curPos);
        local_298 = *piVar5;
      }
      else {
        piVar5 = tcu::Vector<int,_2>::y(&this->m_curPos);
        local_298 = *piVar5;
      }
      iVar2 = de::max<int>(0,widthOffset.m_data[1]._4_4_ - local_298);
      fragmentPos.m_data[1] = de::min<int>((int)widthOffset.m_data[1] - local_298,local_3c);
      while (iVar2 + this->m_curRowFragment < fragmentPos.m_data[1]) {
        fragmentPos.m_data[0] = iVar2 + this->m_curRowFragment;
        tcu::operator*((tcu *)&zb,(Vector<int,_2> *)&maxViewportLimit,fragmentPos.m_data[0]);
        tcu::operator+((tcu *)&local_1e0,&this->m_curPos,(Vector<int,_2> *)&zb);
        if (pfStack_20 != (float *)0x0) {
          pfVar3 = tcu::Vector<float,_4>::z(&this->m_v0);
          fVar7 = *pfVar3;
          pfVar3 = tcu::Vector<float,_4>::z(&this->m_v1);
          pfStack_20[diamondPosition.m_data[1]._4_4_ << 2] =
               (1.0 - (float)local_184._8_4_) * fVar7 + (float)local_184._8_4_ * *pfVar3;
          pfStack_20[diamondPosition.m_data[1]._4_4_ * 4 + 1] = 0.0;
          pfStack_20[diamondPosition.m_data[1]._4_4_ * 4 + 2] = 0.0;
          pfStack_20[diamondPosition.m_data[1]._4_4_ * 4 + 3] = 0.0;
        }
        pfVar3 = depthValues_local + (long)diamondPosition.m_data[1]._4_4_ * 0x10;
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(b1.m_data + 2),1.0 - (float)local_184._8_4_);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(ooSum.m_data + 2),(float)local_184._8_4_)
        ;
        tcu::operator+((tcu *)&local_238,(Vector<float,_4> *)(b1.m_data + 2),
                       (Vector<float,_4> *)(ooSum.m_data + 2));
        tcu::operator/((tcu *)local_228,1.0,&local_238);
        *(undefined8 *)pfVar3 = local_1e0;
        dVar6 = getCoverageBit(1,0,0,0);
        *(deUint64 *)(pfVar3 + 2) = dVar6;
        tcu::operator*((tcu *)&local_248,(Vector<float,_4> *)(b1.m_data + 2),
                       (Vector<float,_4> *)local_228);
        *(undefined8 *)(pfVar3 + 4) = local_248;
        *(undefined8 *)(pfVar3 + 6) = local_240;
        tcu::operator*((tcu *)&local_258,(Vector<float,_4> *)(ooSum.m_data + 2),
                       (Vector<float,_4> *)local_228);
        *(undefined8 *)(pfVar3 + 8) = local_258;
        *(undefined8 *)(pfVar3 + 10) = local_250;
        tcu::Vector<float,_4>::Vector(&local_268,0.0);
        *(undefined8 *)(pfVar3 + 0xc) = local_268.m_data._0_8_;
        *(undefined8 *)(pfVar3 + 0xe) = local_268.m_data._8_8_;
        diamondPosition.m_data[1]._4_4_ = diamondPosition.m_data[1]._4_4_ + 1;
        if (diamondPosition.m_data[1]._4_4_ == numPacketsRasterized_local._4_4_) {
          this->m_curRowFragment = this->m_curRowFragment + 1;
          *(int *)halfPixel = diamondPosition.m_data[1]._4_4_;
          return;
        }
        this->m_curRowFragment = this->m_curRowFragment + 1;
      }
      this->m_curRowFragment = 0;
    }
    piVar5 = tcu::Vector<int,_2>::x(&this->m_curPos);
    *piVar5 = *piVar5 + 1;
    piVar5 = tcu::Vector<int,_2>::x(&this->m_curPos);
    iVar2 = *piVar5;
    piVar5 = tcu::Vector<int,_2>::x(&this->m_bboxMax);
    if (*piVar5 < iVar2) {
      piVar5 = tcu::Vector<int,_2>::y(&this->m_curPos);
      *piVar5 = *piVar5 + 1;
      piVar5 = tcu::Vector<int,_2>::x(&this->m_bboxMin);
      iVar2 = *piVar5;
      piVar5 = tcu::Vector<int,_2>::x(&this->m_curPos);
      *piVar5 = iVar2;
    }
  } while( true );
}

Assistant:

void SingleSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const deInt32								lineWidth			= (m_lineWidth > 1.0f) ? deFloorFloatToInt32(m_lineWidth + 0.5f) : 1;
	const bool									isXMajor			= de::abs((m_v1 - m_v0).x()) >= de::abs((m_v1 - m_v0).y());
	const tcu::IVec2							minorDirection		= (isXMajor) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	const int									minViewportLimit	= (isXMajor) ? (m_viewport.y()) : (m_viewport.x());
	const int									maxViewportLimit	= (isXMajor) ? (m_viewport.y() + m_viewport.w()) : (m_viewport.x() + m_viewport.z());
	const tcu::Vector<deInt64,2>				widthOffset			= -minorDirection.cast<deInt64>() * (toSubpixelCoord(lineWidth - 1) / 2);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy()) + widthOffset;
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy()) + widthOffset;
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											packetNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		// Should current fragment be drawn? == does the segment exit this diamond?
		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			const tcu::Vector<deInt64,2>	pr					= diamondPosition;
			const float						t					= tcu::dot((pr - pa).asFloat(), (pb - pa).asFloat()) / tcu::lengthSquared(pb.asFloat() - pa.asFloat());

			// Rasterize on only fragments that are would end up in the viewport (i.e. visible)
			const int						fragmentLocation	= (isXMajor) ? (m_curPos.y()) : (m_curPos.x());
			const int						rowFragBegin		= de::max(0, minViewportLimit - fragmentLocation);
			const int						rowFragEnd			= de::min(maxViewportLimit - fragmentLocation, lineWidth);

			// Wide lines require multiple fragments.
			for (; rowFragBegin + m_curRowFragment < rowFragEnd; m_curRowFragment++)
			{
				const int			replicationId	= rowFragBegin + m_curRowFragment;
				const tcu::IVec2	fragmentPos		= m_curPos + minorDirection * replicationId;

				// We only rasterize visible area
				DE_ASSERT(LineRasterUtil::inViewport(fragmentPos, m_viewport));

				// Compute depth values.
				if (depthValues)
				{
					const float za = m_v0.z();
					const float zb = m_v1.z();

					depthValues[packetNdx*4+0] = (1 - t) * za + t * zb;
					depthValues[packetNdx*4+1] = 0;
					depthValues[packetNdx*4+2] = 0;
					depthValues[packetNdx*4+3] = 0;
				}

				{
					// output this fragment
					// \note In order to make consistent output with multisampled line rasterization, output "barycentric" coordinates
					FragmentPacket& packet = fragmentPackets[packetNdx];

					const tcu::Vec4		b0		= tcu::Vec4(1 - t);
					const tcu::Vec4		b1		= tcu::Vec4(t);
					const tcu::Vec4		ooSum	= 1.0f / (b0 + b1);

					packet.position			= fragmentPos;
					packet.coverage			= getCoverageBit(1, 0, 0, 0);
					packet.barycentric[0]	= b0 * ooSum;
					packet.barycentric[1]	= b1 * ooSum;
					packet.barycentric[2]	= tcu::Vec4(0.0f);

					packetNdx += 1;
				}

				if (packetNdx == maxFragmentPackets)
				{
					m_curRowFragment++; // don't redraw this fragment again next time
					numPacketsRasterized = packetNdx;
					return;
				}
			}

			m_curRowFragment = 0;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}